

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O0

void INT_EVdfg_add_sink_action(EVdfg_stone stone,char *sink_name)

{
  char *__dest;
  char *in_RSI;
  char *act;
  size_t len;
  size_t in_stack_ffffffffffffffe0;
  
  strlen(in_RSI);
  __dest = (char *)INT_CMmalloc(in_stack_ffffffffffffffe0);
  strcpy(__dest,"sink:");
  strcat(__dest,in_RSI);
  INT_EVdfg_add_action(stone,sink_name);
  free(__dest);
  return;
}

Assistant:

extern void 
INT_EVdfg_add_sink_action(EVdfg_stone stone, char *sink_name)
{
    size_t len = strlen(sink_name) + strlen("sink:");
    char *act = malloc(len + 1);
    strcpy(&act[0], "sink:");
    strcat(&act[0], sink_name);
    INT_EVdfg_add_action(stone, &act[0]);
    free(act);
}